

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBuffer.hpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLBuffer::append(XMLBuffer *this,XMLCh *chars)

{
  long lVar1;
  long lVar2;
  XMLSize_t XVar3;
  
  if ((chars != (XMLCh *)0x0) && (*chars != L'\0')) {
    lVar1 = 0;
    do {
      lVar2 = lVar1;
      lVar1 = lVar2 + 1;
    } while (chars[lVar2] != L'\0');
    XVar3 = this->fIndex;
    if (this->fCapacity <= XVar3 + lVar2) {
      xercesc_4_0::XMLBuffer::ensureCapacity((ulong)this);
      XVar3 = this->fIndex;
    }
    memcpy(this->fBuffer + XVar3,chars,lVar2 * 2);
    this->fIndex = this->fIndex + lVar2;
  }
  return;
}

Assistant:

void append (const XMLCh* const chars)
    {
        if (chars != 0 && *chars != 0) {
            // get length of chars
            XMLSize_t count = 0;
            for (; *(chars+count); count++ ) /*noop*/;

            if (fIndex + count >= fCapacity) {
                ensureCapacity(count);
            }
            memcpy(&fBuffer[fIndex], chars, count * sizeof(XMLCh));
            fIndex += count;
        }
    }